

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O1

Status __thiscall
sentencepiece::SentencePieceProcessor::Decode
          (SentencePieceProcessor *this,vector<int,_std::allocator<int>_> *ids,string *detokenized)

{
  string *psVar1;
  string *in_RCX;
  Status *_status;
  SentencePieceText spt;
  undefined1 local_1a8 [8];
  InternalMetadata local_1a0;
  byte local_180;
  ArenaStringPtr local_160 [6];
  ios_base local_130 [264];
  
  (**(code **)((ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start + 0xe))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    if (in_RCX == (string *)0x0) {
      local_1a8._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"third_party/sentencepiece/src/sentencepiece_processor.cc",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"(",1);
      std::ostream::operator<<((ostringstream *)&local_1a0,0x1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"detokenized",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"output container is null",0x18);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    else {
      *(undefined8 *)(in_RCX + 8) = 0;
      **(undefined1 **)in_RCX = 0;
      SentencePieceText::SentencePieceText((SentencePieceText *)local_1a8,(Arena *)0x0);
      (**(code **)((ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + 0x3e))(this,ids,detokenized,local_1a8);
      if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
        util::Status::~Status((Status *)this);
        local_180 = local_180 | 1;
        if (((ulong)local_1a0.ptr_ & 1) != 0) {
          local_1a0.ptr_ = *(void **)((ulong)local_1a0.ptr_ & 0xfffffffffffffffe);
        }
        psVar1 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                           (local_160,local_1a0.ptr_);
        std::__cxx11::string::operator=(in_RCX,(string *)psVar1);
        util::Status::Status((Status *)this);
      }
      SentencePieceText::~SentencePieceText((SentencePieceText *)local_1a8);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Decode(const std::vector<int> &ids,
                                            std::string *detokenized) const {
  CHECK_OR_RETURN_STATUS_STL(detokenized);

  SentencePieceText spt;
  RETURN_IF_ERROR(Decode(ids, &spt));
  *detokenized = std::move(*spt.mutable_text());

  return util::OkStatus();
}